

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionEval.cpp
# Opt level: O2

bool TestEvaluation(ExpressionContext *ctx,ExprBase *expression,char *resultBuf,uint resultBufSize,
                   char *errorBuf,uint errorBufSize)

{
  bool bVar1;
  ExpressionEvalContext local_280;
  
  if (expression == (ExprBase *)0x0) {
    bVar1 = false;
  }
  else {
    local_280.stackFrames.allocator = ctx->allocator;
    local_280.stackFrames.data = local_280.stackFrames.little;
    local_280.stackFrames.count = 0;
    local_280.stackFrames.max = 0x20;
    local_280.abandonedMemory.data = local_280.abandonedMemory.little;
    local_280.abandonedMemory.count = 0;
    local_280.abandonedMemory.max = 0x20;
    local_280.errorCritical = false;
    local_280.globalFrame = (StackFrame *)0x0;
    local_280.stackDepthLimit = 0x40;
    local_280.variableMemoryLimit = 0x2000;
    local_280.totalMemory = 0;
    local_280.totalMemoryLimit = 0x10000;
    local_280.instruction = 0;
    local_280.instructionsLimit = 0x10000;
    local_280.expressionDepth = 0;
    local_280.expressionDepthLimit = 0x800;
    local_280.emulateKnownExternals = true;
    local_280.ctx = ctx;
    local_280.errorBuf = errorBuf;
    local_280.errorBufSize = errorBufSize;
    local_280.abandonedMemory.allocator = local_280.stackFrames.allocator;
    bVar1 = EvaluateToBuffer(&local_280,expression,resultBuf,resultBufSize);
    ExpressionEvalContext::~ExpressionEvalContext(&local_280);
  }
  return bVar1;
}

Assistant:

bool TestEvaluation(ExpressionContext &ctx, ExprBase *expression, char *resultBuf, unsigned resultBufSize, char *errorBuf, unsigned errorBufSize)
{
	if(!expression)
		return false;

	ExpressionEvalContext evalCtx(ctx, ctx.allocator);

	evalCtx.errorBuf = errorBuf;
	evalCtx.errorBufSize = errorBufSize;

	evalCtx.emulateKnownExternals = true;

	return EvaluateToBuffer(evalCtx, expression, resultBuf, resultBufSize);
}